

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac *pFlac)

{
  ma_bool32 mVar1;
  ma_result mVar2;
  
  do {
    mVar1 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
    if (mVar1 == 0) {
      return 0;
    }
    mVar2 = ma_dr_flac__decode_flac_frame(pFlac);
  } while (mVar2 == MA_CRC_MISMATCH);
  return (uint)(mVar2 == MA_SUCCESS);
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac* pFlac)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    for (;;) {
        ma_result result;
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
        result = ma_dr_flac__decode_flac_frame(pFlac);
        if (result != MA_SUCCESS) {
            if (result == MA_CRC_MISMATCH) {
                continue;
            } else {
                return MA_FALSE;
            }
        }
        return MA_TRUE;
    }
}